

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mipmapped_texture::can_unflip_without_unpacking(mipmapped_texture *this)

{
  bool bVar1;
  uint uVar2;
  vector<crnlib::mip_level_*> *pvVar3;
  mip_level **ppmVar4;
  uint local_20;
  uint local_1c;
  uint m;
  uint l;
  mipmapped_texture *this_local;
  
  bVar1 = is_valid(this);
  if (bVar1) {
    bVar1 = is_packed(this);
    if (bVar1) {
      for (local_1c = 0; uVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&this->m_faces),
          local_1c < uVar2; local_1c = local_1c + 1) {
        local_20 = 0;
        while( true ) {
          pvVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_1c)
          ;
          uVar2 = vector<crnlib::mip_level_*>::size(pvVar3);
          if (uVar2 <= local_20) break;
          pvVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&this->m_faces,local_1c)
          ;
          ppmVar4 = vector<crnlib::mip_level_*>::operator[](pvVar3,local_20);
          bVar1 = mip_level::can_unflip_without_unpacking(*ppmVar4);
          if (!bVar1) {
            return false;
          }
          local_20 = local_20 + 1;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool mipmapped_texture::can_unflip_without_unpacking() const {
  if (!is_valid())
    return false;

  if (!is_packed())
    return true;

  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      if (!m_faces[l][m]->can_unflip_without_unpacking())
        return false;

  return true;
}